

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O1

bool __thiscall
BailoutConstantValue::IsEqual(BailoutConstantValue *this,BailoutConstantValue *bailoutConstValue)

{
  IRType IVar1;
  bool bVar2;
  
  IVar1 = this->type;
  if (IVar1 == bailoutConstValue->type) {
    if ((IVar1 == TyVar) || (IVar1 == TyInt32)) {
      bVar2 = this->u == bailoutConstValue->u;
    }
    else {
      bVar2 = (bool)(-((double)bailoutConstValue->u == (double)this->u) & 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool BailoutConstantValue::IsEqual(const BailoutConstantValue & bailoutConstValue)
{
    if (this->type == bailoutConstValue.type)
    {
        if (this->type == TyInt32)
        {
            return this->u.intConst.value == bailoutConstValue.u.intConst.value;
        }
        else if (this->type == TyVar)
        {
            return this->u.varConst.value == bailoutConstValue.u.varConst.value;
        }
        else
        {
            return this->u.floatConst.value == bailoutConstValue.u.floatConst.value;
        }
    }
    return false;
}